

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O1

void duckdb::ColumnArrowToDuckDBDictionary
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               uint64_t parent_offset)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var4;
  ArrowArray *pAVar5;
  void *pvVar6;
  unsigned_long *puVar7;
  byte bVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  bool bVar9;
  VectorBuffer *pVVar10;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var11;
  unsigned_long uVar12;
  __uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> this_00;
  type pVVar13;
  ArrowType *this_01;
  idx_t iVar14;
  long lVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  Vector *other;
  char cVar17;
  data_ptr_t indices_p;
  idx_t i;
  ulong uVar18;
  bool add_null;
  LogicalType offset_type;
  SelectionVector sel;
  uint64_t in_stack_ffffffffffffff10;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_d0;
  ValidityMask local_c8;
  LogicalType local_a0;
  ArrowScanLocalState *local_88;
  ArrowType *local_80;
  SelectionVector local_78;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  int64_t local_40;
  idx_t local_38;
  
  peVar1 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_80 = arrow_type;
  local_40 = nested_offset;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (peVar1 != (element_type *)0x0) {
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         (vector->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (vector->buffer).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((element_type *)
        local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((element_type *)
                 local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->type =
             *(int *)&((element_type *)
                      local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->type + 1;
        UNLOCK();
      }
      else {
        *(int *)&((element_type *)
                 local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->type =
             *(int *)&((element_type *)
                      local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->type + 1;
      }
    }
    pVVar10 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                        ((shared_ptr<duckdb::VectorBuffer,_true> *)&local_c8);
    _Var11._M_head_impl = (VectorAuxiliaryData *)operator_new(0x20);
    peVar3 = (array_state->owned_data).internal.
             super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (array_state->owned_data).internal.
             super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    (_Var11._M_head_impl)->type = ARROW_AUXILIARY;
    (_Var11._M_head_impl)->_vptr_VectorAuxiliaryData =
         (_func_int **)&PTR__ArrowAuxiliaryData_02488f68;
    _Var11._M_head_impl[1]._vptr_VectorAuxiliaryData = (_func_int **)peVar3;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var11._M_head_impl + 1) + 8) = p_Var2
    ;
    _Var4._M_head_impl =
         (pVVar10->aux_data).
         super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
         .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
    (pVVar10->aux_data).
    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var11._M_head_impl;
    if (_Var4._M_head_impl != (VectorAuxiliaryData *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
    }
    if ((element_type *)
        local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
  }
  add_null = true;
  if (array->null_count < 1) {
    if (parent_mask == (ValidityMask *)0x0) {
      add_null = false;
    }
    else {
      add_null = (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
                 (unsigned_long *)0x0;
    }
  }
  local_88 = array_state->state;
  bVar9 = ArrowArrayScanState::CacheOutdated(array_state,array->dictionary);
  if (bVar9) {
    uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(array->dictionary->length);
    this_00._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_c8,&vector->type);
    Vector::Vector((Vector *)
                   this_00._M_t.
                   super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
                   super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl,
                   (LogicalType *)&local_c8,uVar12);
    local_a0._0_8_ =
         this_00._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
         .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    LogicalType::~LogicalType((LogicalType *)&local_c8);
    pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                         &local_a0);
    pAVar5 = array->dictionary;
    uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
    FlatVector::VerifyFlatVector(pVVar13);
    GetValidityMask(&pVVar13->validity,pAVar5,local_88,uVar12,0,0,add_null);
    this_01 = ArrowType::GetDictionary(local_80);
    bVar9 = ArrowType::HasDictionary(this_01);
    if (bVar9) {
      cVar17 = '\0';
    }
    else {
      bVar9 = ArrowType::RunEndEncoded(this_01);
      cVar17 = '\x02' - bVar9;
    }
    if (cVar17 == '\0') {
      pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           &local_a0);
      pAVar5 = array->dictionary;
      uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
      ColumnArrowToDuckDBDictionary
                (pVVar13,pAVar5,array_state,uVar12,this_01,-1,(ValidityMask *)0x0,0);
    }
    else if (cVar17 == '\x01') {
      pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           &local_a0);
      pAVar5 = array->dictionary;
      uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
      ColumnArrowToDuckDBRunEndEncoded
                (pVVar13,pAVar5,array_state,uVar12,this_01,-1,(ValidityMask *)0x0,
                 in_stack_ffffffffffffff10);
    }
    else {
      pVVar13 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           &local_a0);
      pAVar5 = array->dictionary;
      uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
      ColumnArrowToDuckDB(pVVar13,pAVar5,array_state,uVar12,this_01,-1,(ValidityMask *)0x0,0,false);
    }
    local_d0._M_head_impl = (Vector *)local_a0._0_8_;
    local_a0._0_8_ = (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0;
    ArrowArrayScanState::AddDictionary
              (array_state,
               (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)&local_d0,
               array->dictionary);
    if (local_d0._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_d0,local_d0._M_head_impl);
    }
    local_d0._M_head_impl = (Vector *)0x0;
    if ((_Head_base<0UL,_duckdb::Vector_*,_false>)local_a0._0_8_ !=
        (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_a0,(Vector *)local_a0._0_8_);
    }
  }
  ArrowType::GetDuckType(&local_a0,local_80,false);
  pvVar6 = array->buffers[1];
  iVar14 = GetTypeIdSize(local_a0.physical_type_);
  lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  if (local_40 == -1) {
    lVar15 = array->offset + lVar15 + local_88->chunk_offset;
  }
  else {
    lVar15 = array->offset + local_40;
  }
  indices_p = (data_ptr_t)((long)pvVar6 + lVar15 * iVar14);
  local_78.sel_vector = (sel_t *)0x0;
  local_78.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_78.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (add_null == false) {
    SetSelectionVector(&local_78,indices_p,&local_a0,size,(ValidityMask *)0x0,0);
  }
  else {
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    lVar15 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
    GetValidityMask(&local_c8,array,local_88,size,lVar15,-1,false);
    if ((parent_mask != (ValidityMask *)0x0) &&
       (size != 0 &&
        (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
        (unsigned_long *)0x0)) {
      uVar18 = 0;
      do {
        puVar7 = (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((puVar7 != (unsigned_long *)0x0) && ((puVar7[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) == 0))
        {
          if ((element_type *)local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (element_type *)0x0) {
            local_38 = local_c8.super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_58,&local_38);
            p_Var2 = p_Stack_50;
            local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_58;
            this._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
            local_58 = (element_type *)0x0;
            p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var2;
            if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
            }
            if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data)
            ;
            local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          bVar8 = (byte)uVar18 & 0x3f;
          local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar18 >> 6] =
               local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar18 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        uVar18 = uVar18 + 1;
      } while (size != uVar18);
    }
    uVar12 = NumericCastImpl<unsigned_long,_long,_false>::Convert(array->dictionary->length);
    SetSelectionVector(&local_78,indices_p,&local_a0,size,&local_c8,uVar12);
    if (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  other = ArrowArrayScanState::GetDictionary(array_state);
  Vector::Slice(vector,other,&local_78,size);
  Vector::Verify(vector,size);
  if (local_78.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  LogicalType::~LogicalType(&local_a0);
  return;
}

Assistant:

static void ColumnArrowToDuckDBDictionary(Vector &vector, ArrowArray &array, ArrowArrayScanState &array_state,
                                          idx_t size, const ArrowType &arrow_type, int64_t nested_offset,
                                          const ValidityMask *parent_mask, uint64_t parent_offset) {
	if (vector.GetBuffer()) {
		vector.GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(array_state.owned_data));
	}
	D_ASSERT(arrow_type.HasDictionary());
	auto &scan_state = array_state.state;
	const bool has_nulls = CanContainNull(array, parent_mask);
	if (array_state.CacheOutdated(array.dictionary)) {
		//! We need to set the dictionary data for this column
		auto base_vector = make_uniq<Vector>(vector.GetType(), NumericCast<idx_t>(array.dictionary->length));
		SetValidityMask(*base_vector, *array.dictionary, scan_state, NumericCast<idx_t>(array.dictionary->length), 0, 0,
		                has_nulls);
		auto &dictionary_type = arrow_type.GetDictionary();
		auto arrow_physical_type = GetArrowArrayPhysicalType(dictionary_type);
		switch (arrow_physical_type) {
		case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
			ColumnArrowToDuckDBDictionary(*base_vector, *array.dictionary, array_state,
			                              NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		case ArrowArrayPhysicalType::RUN_END_ENCODED:
			ColumnArrowToDuckDBRunEndEncoded(*base_vector, *array.dictionary, array_state,
			                                 NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		case ArrowArrayPhysicalType::DEFAULT:
			ColumnArrowToDuckDB(*base_vector, *array.dictionary, array_state,
			                    NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		default:
			throw NotImplementedException("ArrowArrayPhysicalType not recognized");
		};
		array_state.AddDictionary(std::move(base_vector), array.dictionary);
	}
	auto offset_type = arrow_type.GetDuckType();
	//! Get Pointer to Indices of Dictionary
	auto indices = ArrowBufferData<data_t>(array, 1) +
	               GetTypeIdSize(offset_type.InternalType()) *
	                   GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset), scan_state, nested_offset);

	SelectionVector sel;
	if (has_nulls) {
		ValidityMask indices_validity;
		GetValidityMask(indices_validity, array, scan_state, size, NumericCast<int64_t>(parent_offset));
		if (parent_mask && !parent_mask->AllValid()) {
			auto &struct_validity_mask = *parent_mask;
			for (idx_t i = 0; i < size; i++) {
				if (!struct_validity_mask.RowIsValid(i)) {
					indices_validity.SetInvalid(i);
				}
			}
		}
		SetSelectionVector(sel, indices, offset_type, size, &indices_validity,
		                   NumericCast<idx_t>(array.dictionary->length));
	} else {
		SetSelectionVector(sel, indices, offset_type, size);
	}
	vector.Slice(array_state.GetDictionary(), sel, size);
	vector.Verify(size);
}